

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O2

_Bool do_constant_folding_cond_64(uint64_t x,uint64_t y,TCGCond c)

{
  undefined8 in_R8;
  undefined8 in_R9;
  
  switch(c) {
  case TCG_COND_LT:
    return (long)x < (long)y;
  case TCG_COND_GE:
    return (long)y <= (long)x;
  case TCG_COND_LTU:
    return x < y;
  case TCG_COND_GEU:
    return y <= x;
  default:
    fprintf(_stderr,"%s:%d: tcg fatal error\n",
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/optimize.c"
            ,0x1df,in_R8,in_R9,&switchD_00b5942a::switchdataD_00bd60d0);
    abort();
  case TCG_COND_EQ:
    return x == y;
  case TCG_COND_NE:
    return x != y;
  case TCG_COND_LE:
    return (long)x <= (long)y;
  case TCG_COND_GT:
    return (long)y < (long)x;
  case TCG_COND_LEU:
    return x <= y;
  case TCG_COND_GTU:
    return y < x;
  }
}

Assistant:

static bool do_constant_folding_cond_64(uint64_t x, uint64_t y, TCGCond c)
{
    switch (c) {
    case TCG_COND_EQ:
        return x == y;
    case TCG_COND_NE:
        return x != y;
    case TCG_COND_LT:
        return (int64_t)x < (int64_t)y;
    case TCG_COND_GE:
        return (int64_t)x >= (int64_t)y;
    case TCG_COND_LE:
        return (int64_t)x <= (int64_t)y;
    case TCG_COND_GT:
        return (int64_t)x > (int64_t)y;
    case TCG_COND_LTU:
        return x < y;
    case TCG_COND_GEU:
        return x >= y;
    case TCG_COND_LEU:
        return x <= y;
    case TCG_COND_GTU:
        return x > y;
    default:
        tcg_abort();
    }
}